

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::JoinRef::Deserialize(JoinRef *this,Deserializer *deserializer)

{
  JoinType JVar1;
  JoinRefType JVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  pointer pJVar6;
  byte bVar7;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var10;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var11;
  string str;
  __uniq_ptr_impl<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>_> local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [32];
  
  local_70._M_t.super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
  super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl =
       (tuple<duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>)operator_new(0xc0);
  *(undefined1 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 8) = 3;
  *(_func_int ***)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x10) =
       (_func_int **)
       ((long)local_70._M_t.
              super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
              super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x20);
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x18) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x20) = 0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x30) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x38) =
       (_func_int *)0xffffffffffffffff;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x40) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x48) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x50) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x58) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x60) = (_func_int *)0x0;
  *(undefined ***)
   local_70._M_t.super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
   super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl = &PTR__JoinRef_01987408;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x68) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x70) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x78) = (_func_int *)0x0;
  *(undefined2 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x80) = 3;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x88) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x90) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0x98) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xa0) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xa8) = (_func_int *)0x0;
  *(_func_int **)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xb0) = (_func_int *)0x0;
  *(undefined1 *)
   ((long)local_70._M_t.
          super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
          super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl + 0xb8) = 0;
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"left");
  bVar7 = (byte)iVar4;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pJVar6->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pJVar6->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
    if (_Var8._M_head_impl != (TableRef *)0x0) goto LAB_005d076e;
    bVar7 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var10._M_head_impl = (TableRef *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      TableRef::Deserialize((TableRef *)local_68,deserializer);
      _Var10._M_head_impl = (TableRef *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pJVar6->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pJVar6->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (TableRef *)0x0) {
      bVar7 = 1;
    }
    else {
LAB_005d076e:
      (*(_Var8._M_head_impl)->_vptr_TableRef[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"right");
  bVar7 = (byte)iVar4;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pJVar6->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pJVar6->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
    if (_Var8._M_head_impl == (TableRef *)0x0) {
      bVar7 = 0;
      goto LAB_005d081a;
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var10._M_head_impl = (TableRef *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      TableRef::Deserialize((TableRef *)local_68,deserializer);
      _Var10._M_head_impl = (TableRef *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pJVar6->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
         _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pJVar6->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (TableRef *)0x0) {
      bVar7 = 1;
      goto LAB_005d081a;
    }
  }
  (*(_Var8._M_head_impl)->_vptr_TableRef[1])();
LAB_005d081a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"condition");
  if ((char)uVar5 == '\0') {
    _Var9._M_head_impl =
         (pJVar6->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar6->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var11._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_68,deserializer);
      _Var11._M_head_impl = (ParsedExpression *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var9._M_head_impl =
         (pJVar6->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar6->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var11._M_head_impl;
  }
  if (_Var9._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)((long)((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))();
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"join_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    JVar1 = EnumUtil::FromString<duckdb::JoinType>((char *)local_68._0_8_);
    if ((TableRef *)local_68._0_8_ != (TableRef *)local_58) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    JVar1 = (JoinType)iVar4;
  }
  pJVar6->type = JVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"ref_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    JVar2 = EnumUtil::FromString<duckdb::JoinRefType>((char *)local_68._0_8_);
    if ((TableRef *)local_68._0_8_ != (TableRef *)local_58) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    JVar2 = (JoinRefType)iVar4;
  }
  pJVar6->ref_type = JVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcd,"using_columns",&pJVar6->using_columns);
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xce,"delim_flipped");
  if ((char)uVar5 == '\0') {
    uVar3 = false;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (undefined1)iVar4;
  }
  pJVar6->delim_flipped = (bool)uVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_70);
  uVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcf,"duplicate_eliminated_columns");
  if ((char)uVar5 == '\0') {
    local_58._0_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._0_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._0_8_ = 0;
    local_48._8_8_ = 0;
    local_48._16_8_ = (SampleOptions *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_68);
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)local_48,deserializer);
    local_58._0_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48._16_8_;
    local_68._0_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (pJVar6->duplicate_eliminated_columns).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
    (pJVar6->duplicate_eliminated_columns).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
    local_48._0_8_ = 0;
    local_48._8_8_ = 0;
    local_48._16_8_ =
         (tuple<duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_68);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar5 & 0xff));
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_70._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinRef_*,_std::default_delete<duckdb::JoinRef>_>.
       super__Head_base<0UL,_duckdb::JoinRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> JoinRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<JoinRef>(new JoinRef());
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(200, "left", result->left);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(201, "right", result->right);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "condition", result->condition);
	deserializer.ReadProperty<JoinType>(203, "join_type", result->type);
	deserializer.ReadProperty<JoinRefType>(204, "ref_type", result->ref_type);
	deserializer.ReadPropertyWithDefault<vector<string>>(205, "using_columns", result->using_columns);
	deserializer.ReadPropertyWithDefault<bool>(206, "delim_flipped", result->delim_flipped);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(207, "duplicate_eliminated_columns", result->duplicate_eliminated_columns);
	return std::move(result);
}